

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_wait(Curl_multi *multi,curl_waitfd *extra_fds,uint extra_nfds,int timeout_ms,
                         int *ret)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  Curl_easy *pCVar7;
  int iVar8;
  ushort uVar9;
  pollfd *ppVar10;
  uint nfds;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  curl_socket_t sockbunch [5];
  long timeout_internal;
  pollfd a_few_on_stack [10];
  uint local_b8 [8];
  int *local_98;
  ulong local_90;
  pollfd local_88 [11];
  
  if (multi == (Curl_multi *)0x0) {
    return CURLM_BAD_HANDLE;
  }
  if (multi->type != 0xbab1e) {
    return CURLM_BAD_HANDLE;
  }
  if (multi->in_callback != false) {
    return CURLM_RECURSIVE_API_CALL;
  }
  local_98 = ret;
  multi_timeout(multi,(long *)&local_90);
  uVar6 = (ulong)(uint)timeout_ms;
  if ((long)local_90 < (long)timeout_ms) {
    uVar6 = local_90 & 0xffffffff;
  }
  if ((long)local_90 < 0) {
    uVar6 = (ulong)(uint)timeout_ms;
  }
  iVar5 = (int)uVar6;
  pCVar7 = multi->easyp;
  iVar8 = 0;
  if (pCVar7 != (Curl_easy *)0x0) {
    do {
      uVar1 = multi_getsock(pCVar7,(curl_socket_t *)local_b8,(int)uVar6);
      uVar3 = 0;
      do {
        if ((uVar1 >> ((uint)uVar3 & 0x1f) & 1) == 0) {
          uVar6 = 0xffffffff;
        }
        else {
          iVar8 = iVar8 + 1;
          uVar6 = (ulong)local_b8[uVar3];
        }
        if (((uVar1 >> ((byte)uVar3 & 0x1f)) >> 0x10 & 1) != 0) {
          iVar8 = iVar8 + 1;
          uVar6 = (ulong)local_b8[uVar3];
        }
      } while (((int)uVar6 != -1) && (uVar6 = uVar3 + 1, bVar11 = uVar3 < 4, uVar3 = uVar6, bVar11))
      ;
      pCVar7 = pCVar7->next;
    } while (pCVar7 != (Curl_easy *)0x0);
  }
  nfds = 0;
  uVar1 = iVar8 + extra_nfds;
  if (uVar1 == 0) {
    ppVar10 = (pollfd *)0x0;
  }
  else {
    if (10 < uVar1) {
      auVar13 = (undefined1  [16])(*Curl_cmalloc)((ulong)uVar1 << 3);
      if (auVar13._0_8_ == 0) {
        return CURLM_OUT_OF_MEMORY;
      }
      bVar11 = true;
      goto LAB_00129814;
    }
    ppVar10 = local_88;
  }
  auVar13._8_8_ = uVar6;
  auVar13._0_8_ = ppVar10;
  bVar11 = false;
LAB_00129814:
  uVar6 = auVar13._8_8_;
  ppVar10 = auVar13._0_8_;
  if ((iVar8 != 0) && (pCVar7 = multi->easyp, pCVar7 != (Curl_easy *)0x0)) {
    uVar3 = 0;
    do {
      uVar1 = multi_getsock(pCVar7,(curl_socket_t *)local_b8,(int)uVar6);
      uVar4 = 0;
      do {
        if ((uVar1 >> ((uint)uVar4 & 0x1f) & 1) == 0) {
          uVar6 = 0xffffffff;
        }
        else {
          uVar6 = (ulong)local_b8[uVar4];
          ppVar10[uVar3].fd = local_b8[uVar4];
          ppVar10[uVar3].events = 1;
          uVar3 = (ulong)((int)uVar3 + 1);
        }
        if (((uVar1 >> ((byte)uVar4 & 0x1f)) >> 0x10 & 1) != 0) {
          uVar6 = (ulong)local_b8[uVar4];
          ppVar10[uVar3].fd = local_b8[uVar4];
          ppVar10[uVar3].events = 4;
          uVar3 = (ulong)((int)uVar3 + 1);
        }
        nfds = (uint)uVar3;
      } while (((int)uVar6 != -1) && (uVar6 = uVar4 + 1, bVar12 = uVar4 < 4, uVar4 = uVar6, bVar12))
      ;
      pCVar7 = pCVar7->next;
    } while (pCVar7 != (Curl_easy *)0x0);
  }
  if (extra_nfds != 0) {
    uVar6 = 0;
    do {
      uVar1 = nfds + (int)uVar6;
      ppVar10[uVar1].fd = extra_fds[uVar6].fd;
      uVar9 = extra_fds[uVar6].events & 1;
      ppVar10[uVar1].events = uVar9;
      if ((extra_fds[uVar6].events & 6U) != 0) {
        ppVar10[uVar1].events = uVar9 | extra_fds[uVar6].events & 6U;
      }
      uVar6 = uVar6 + 1;
    } while (extra_nfds != uVar6);
    nfds = nfds + (int)uVar6;
  }
  if (nfds == 0) {
    iVar5 = 0;
  }
  else {
    iVar2 = Curl_poll(ppVar10,nfds,iVar5);
    iVar5 = 0;
    if (0 < iVar2) {
      iVar5 = iVar2;
    }
    if (0 < iVar2 && extra_nfds != 0) {
      uVar6 = 0;
      do {
        extra_fds[uVar6].revents = ppVar10[(uint)(iVar8 + (int)uVar6)].revents & 7;
        uVar6 = uVar6 + 1;
        iVar5 = iVar2;
      } while (extra_nfds != uVar6);
    }
  }
  if (bVar11) {
    (*Curl_cfree)(ppVar10);
  }
  if (local_98 != (int *)0x0) {
    *local_98 = iVar5;
  }
  return CURLM_OK;
}

Assistant:

CURLMcode curl_multi_wait(struct Curl_multi *multi,
                          struct curl_waitfd extra_fds[],
                          unsigned int extra_nfds,
                          int timeout_ms,
                          int *ret)
{
  struct Curl_easy *data;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  unsigned int i;
  unsigned int nfds = 0;
  unsigned int curlfds;
  struct pollfd *ufds = NULL;
  bool ufds_malloc = FALSE;
  long timeout_internal;
  int retcode = 0;
  struct pollfd a_few_on_stack[NUM_POLLS_ON_STACK];

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  /* If the internally desired timeout is actually shorter than requested from
     the outside, then use the shorter time! But only if the internal timer
     is actually larger than -1! */
  (void)multi_timeout(multi, &timeout_internal);
  if((timeout_internal >= 0) && (timeout_internal < (long)timeout_ms))
    timeout_ms = (int)timeout_internal;

  /* Count up how many fds we have from the multi handle */
  data = multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if(bitmap & GETSOCK_READSOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(bitmap & GETSOCK_WRITESOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD) {
        break;
      }
    }

    data = data->next; /* check next handle */
  }

  curlfds = nfds; /* number of internal file descriptors */
  nfds += extra_nfds; /* add the externally provided ones */

  if(nfds) {
    if(nfds > NUM_POLLS_ON_STACK) {
      /* 'nfds' is a 32 bit value and 'struct pollfd' is typically 8 bytes
         big, so at 2^29 sockets this value might wrap. When a process gets
         the capability to actually handle over 500 million sockets this
         calculation needs a integer overflow check. */
      ufds = malloc(nfds * sizeof(struct pollfd));
      if(!ufds)
        return CURLM_OUT_OF_MEMORY;
      ufds_malloc = TRUE;
    }
    else
      ufds = &a_few_on_stack[0];
  }
  nfds = 0;

  /* only do the second loop if we found descriptors in the first stage run
     above */

  if(curlfds) {
    /* Add the curl handles to our pollfds first */
    data = multi->easyp;
    while(data) {
      bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

      for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
        curl_socket_t s = CURL_SOCKET_BAD;

        if(bitmap & GETSOCK_READSOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLIN;
          ++nfds;
          s = sockbunch[i];
        }
        if(bitmap & GETSOCK_WRITESOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLOUT;
          ++nfds;
          s = sockbunch[i];
        }
        if(s == CURL_SOCKET_BAD) {
          break;
        }
      }

      data = data->next; /* check next handle */
    }
  }

  /* Add external file descriptions from poll-like struct curl_waitfd */
  for(i = 0; i < extra_nfds; i++) {
    ufds[nfds].fd = extra_fds[i].fd;
    ufds[nfds].events = 0;
    if(extra_fds[i].events & CURL_WAIT_POLLIN)
      ufds[nfds].events |= POLLIN;
    if(extra_fds[i].events & CURL_WAIT_POLLPRI)
      ufds[nfds].events |= POLLPRI;
    if(extra_fds[i].events & CURL_WAIT_POLLOUT)
      ufds[nfds].events |= POLLOUT;
    ++nfds;
  }

  if(nfds) {
    int pollrc;
    /* wait... */
    pollrc = Curl_poll(ufds, nfds, timeout_ms);
    DEBUGF(infof(data, "Curl_poll(%d ds, %d ms) == %d\n",
                 nfds, timeout_ms, pollrc));

    if(pollrc > 0) {
      retcode = pollrc;
      /* copy revents results from the poll to the curl_multi_wait poll
         struct, the bit values of the actual underlying poll() implementation
         may not be the same as the ones in the public libcurl API! */
      for(i = 0; i < extra_nfds; i++) {
        unsigned short mask = 0;
        unsigned r = ufds[curlfds + i].revents;

        if(r & POLLIN)
          mask |= CURL_WAIT_POLLIN;
        if(r & POLLOUT)
          mask |= CURL_WAIT_POLLOUT;
        if(r & POLLPRI)
          mask |= CURL_WAIT_POLLPRI;

        extra_fds[i].revents = mask;
      }
    }
  }

  if(ufds_malloc)
    free(ufds);
  if(ret)
    *ret = retcode;
  return CURLM_OK;
}